

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O2

int cpu_exec_tricore(uc_struct_conflict15 *uc,CPUState *cpu)

{
  uint uVar1;
  uc_struct_conflict7 *puVar2;
  void *pvVar3;
  CPUClass *pCVar4;
  TranslationBlock *pTVar5;
  long lVar6;
  CPUWatchpoint *pCVar7;
  _Bool _Var8;
  char cVar9;
  int iVar10;
  uint uVar11;
  tcg_target_ulong tVar12;
  target_ulong_conflict *ptVar13;
  TranslationBlock *pTVar14;
  uint uVar15;
  list_item *plVar16;
  ulong uVar17;
  long lVar18;
  anon_union_16_2_aaf24f3d_for_entry *paVar19;
  target_ulong_conflict *ptVar20;
  uint cf_mask;
  CPUClass *pCVar21;
  uint32_t cflags;
  bool bVar22;
  undefined1 auVar23 [16];
  target_ulong_conflict *ptStack_70;
  ulong local_50;
  undefined4 local_48;
  ulong local_40;
  undefined4 local_38;
  
  pCVar21 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar21->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var8 = (*pCVar21->has_work)((CPUState_conflict *)cpu);
    if (!_Var8) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar21->cpu_exec_enter)((CPUState_conflict *)cpu);
  iVar10 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  if (iVar10 != 0) {
    pCVar21 = cpu->cc;
  }
LAB_00b2ecdc:
  puVar2 = cpu->uc;
  uVar15 = cpu->exception_index;
  if (puVar2->stop_interrupt != (uc_args_int_t_conflict7)0x0) {
    _Var8 = (*puVar2->stop_interrupt)(puVar2,uVar15);
    if (_Var8) {
      plVar16 = (list_item *)(puVar2->hook + 0xe);
      goto LAB_00b2f134;
    }
    uVar15 = cpu->exception_index;
  }
  if (-1 < (int)uVar15) {
    if (0xffff < uVar15) {
      if (uVar15 == 0x10002) {
        pCVar4 = cpu->cc;
        if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
          paVar19 = (anon_union_16_2_aaf24f3d_for_entry *)&cpu->watchpoints;
          while (pCVar7 = paVar19->tqe_next, pCVar7 != (CPUWatchpoint *)0x0) {
            *(byte *)&pCVar7->flags = (byte)pCVar7->flags & 0x3f;
            paVar19 = &pCVar7->entry;
          }
        }
        (*pCVar4->debug_excp_handler)((CPUState_conflict *)cpu);
      }
      cpu->exception_index = -1;
      goto LAB_00b2f1b8;
    }
    plVar16 = (list_item *)puVar2->hook;
    bVar22 = false;
    while ((plVar16 = plVar16->next, plVar16 != (list_item *)0x0 &&
           (pvVar3 = plVar16->data, pvVar3 != (void *)0x0))) {
      if (*(char *)((long)pvVar3 + 0x14) == '\0') {
        (**(code **)((long)pvVar3 + 0x28))
                  (puVar2,cpu->exception_index,*(undefined8 *)((long)pvVar3 + 0x30));
        bVar22 = true;
      }
    }
    if (!bVar22) goto LAB_00b2f18d;
    cpu->exception_index = -1;
  }
  ptStack_70 = (target_ulong_conflict *)0x0;
  ptVar20 = ptStack_70;
  while( true ) {
    pCVar4 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0x72a) = 0;
    uVar15 = cpu->interrupt_request;
    if (uVar15 != 0) {
      uVar11 = uVar15;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar11 = uVar15 & 0xffffeda5;
      }
      if ((char)uVar11 < '\0') {
        cpu->interrupt_request = uVar15 & 0xffffff7f;
        cpu->exception_index = 0x10002;
        goto LAB_00b2ecdc;
      }
      if ((uVar11 >> 10 & 1) != 0) {
        cpu_reset(cpu);
        goto LAB_00b2ecdc;
      }
      _Var8 = (*pCVar4->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar11);
      if (_Var8) {
        cpu->exception_index = -1;
        ptVar20 = (target_ulong_conflict *)0x0;
      }
      if ((cpu->interrupt_request & 4) != 0) {
        cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
        ptVar20 = (target_ulong_conflict *)0x0;
      }
    }
    if (cpu->exit_request == true) break;
    cflags = cpu->cflags_next_tb;
    if (cflags == 0xffffffff) {
      cflags = 0;
    }
    else {
      cpu->cflags_next_tb = 0xffffffff;
    }
    puVar2 = cpu->uc;
    uVar15 = *(uint *)((long)cpu->env_ptr + 0x9c);
    uVar11 = uVar15 >> 8 ^ uVar15;
    uVar11 = uVar11 & 0x3f | uVar11 >> 8 & 0xfc0;
    pTVar14 = cpu->tb_jmp_cache[uVar11];
    cf_mask = cpu->cluster_index << 0x18 | cflags & 0xffffff;
    if (((((pTVar14 == (TranslationBlock *)0x0) || ((uint)pTVar14->pc != uVar15)) ||
         (*(int *)((long)&pTVar14->pc + 4) != 0)) ||
        (((int)pTVar14->cs_base != 0 ||
         (uVar1._0_2_ = pTVar14->size, uVar1._2_2_ = pTVar14->icount,
         cpu->trace_dstate[0] != (ulong)uVar1)))) || ((pTVar14->flags & 0xff0effff) != cf_mask)) {
      pTVar14 = tb_htable_lookup_tricore(cpu,(ulong)uVar15,0,0,cf_mask);
      if (pTVar14 == (TranslationBlock *)0x0) {
        pTVar14 = (TranslationBlock *)tb_gen_code_tricore(cpu,uVar15,0,0,cflags);
        cpu->tb_jmp_cache[uVar11] = pTVar14;
        pTVar5 = puVar2->last_tb;
        if (pTVar5 != (TranslationBlock *)0x0) {
          local_40 = (ulong)(uint)pTVar14->pc;
          auVar23 = ZEXT416(*(uint *)((long)&pTVar14->cs_base + 4));
          auVar23 = pshuflw(auVar23,auVar23,0xe1);
          local_38 = auVar23._0_4_;
          local_50 = (ulong)(uint)pTVar5->pc;
          auVar23 = ZEXT416(*(uint *)((long)&pTVar5->cs_base + 4));
          auVar23 = pshuflw(auVar23,auVar23,0xe1);
          local_48 = auVar23._0_4_;
          plVar16 = (list_item *)(puVar2->hook + 0xf);
          while ((plVar16 = plVar16->next, plVar16 != (list_item *)0x0 &&
                 (pvVar3 = plVar16->data, pvVar3 != (void *)0x0))) {
            if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
               (uVar17 = (ulong)(uint)pTVar14->pc,
               *(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18) ||
               uVar17 <= *(ulong *)((long)pvVar3 + 0x20) &&
               *(ulong *)((long)pvVar3 + 0x18) <= uVar17)) {
              (**(code **)((long)pvVar3 + 0x28))
                        (puVar2,&local_40,&local_50,*(undefined8 *)((long)pvVar3 + 0x30));
            }
          }
        }
      }
      else {
        cpu->tb_jmp_cache[uVar11] = pTVar14;
      }
    }
    if ((ptVar20 != (target_ulong_conflict *)0x0) && (pTVar14->page_addr[0] == 0xffffffffffffffff))
    {
      if (1 < (uint)ptStack_70) {
        __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                      ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
      }
      if ((pTVar14->flags & 0x40000) == 0) {
        LOCK();
        bVar22 = *(long *)(ptVar20 + (long)ptStack_70 * 2 + 0x20) == 0;
        if (bVar22) {
          *(TranslationBlock **)(ptVar20 + (long)ptStack_70 * 2 + 0x20) = pTVar14;
        }
        UNLOCK();
        if (bVar22) {
          *(uint32_t *)(*(long *)(ptVar20 + (long)ptStack_70 * 2 + 0x16) + *(long *)(ptVar20 + 6)) =
               (pTVar14->cflags -
               ((int)*(long *)(ptVar20 + (long)ptStack_70 * 2 + 0x16) + (int)*(long *)(ptVar20 + 6))
               ) + -4;
          *(uintptr_t *)(ptVar20 + (long)ptStack_70 * 2 + 0x1c) = pTVar14->jmp_target_arg[1];
          pTVar14->jmp_target_arg[1] = (ulong)ptVar20 | (ulong)ptStack_70;
        }
      }
    }
    if (cpu->exit_request == false) {
      tVar12 = cpu_tb_exec(cpu,pTVar14);
      cpu->uc->last_tb = pTVar14;
      ptVar13 = (target_ulong_conflict *)(tVar12 & 0xfffffffffffffffc);
      uVar15 = (uint)tVar12 & 3;
      ptStack_70 = (target_ulong_conflict *)(ulong)uVar15;
      ptVar20 = ptVar13;
      if (uVar15 == 3) {
        ptVar20 = (target_ulong_conflict *)0x0;
        ptStack_70 = (target_ulong_conflict *)0x3;
        if (-1 < *(int *)(cpu[1].tb_jmp_cache + 0xe5)) {
          lVar6 = cpu->icount_budget;
          lVar18 = 0xffff;
          if (lVar6 < 0xffff) {
            lVar18 = lVar6;
          }
          uVar15 = (uint)lVar18;
          *(short *)(cpu[1].tb_jmp_cache + 0xe5) = (short)lVar18;
          cpu->icount_extra = lVar6 - (int)uVar15;
          ptVar20 = (target_ulong_conflict *)0x0;
          ptStack_70 = (target_ulong_conflict *)0x3;
          if (0 < (int)uVar15 && lVar6 - (int)uVar15 == 0) {
            uVar11 = 0x7fff;
            if (uVar15 < 0x7fff) {
              uVar11 = uVar15;
            }
            pTVar14 = (TranslationBlock *)
                      tb_gen_code_tricore(cpu,*ptVar13,ptVar13[1],ptVar13[2],uVar11 | 0x10000);
            (pTVar14->tc).size = (size_t)ptVar13;
            cpu_tb_exec(cpu,pTVar14);
            tb_phys_invalidate_tricore
                      ((TCGContext_conflict9 *)cpu->uc->tcg_ctx,(TranslationBlock_conflict *)pTVar14
                       ,0xffffffffffffffff);
            tcg_tb_remove_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx,pTVar14);
            ptVar20 = (target_ulong_conflict *)0x0;
            ptStack_70 = (target_ulong_conflict *)0x3;
          }
        }
      }
    }
  }
  cpu->exit_request = false;
  if (cpu->exception_index == -1) {
    cpu->exception_index = 0x10000;
  }
  goto LAB_00b2ecdc;
LAB_00b2f18d:
  puVar2->invalid_error = 0x15;
  cpu->halted = 1;
  goto LAB_00b2f1af;
  while ((*(char *)((long)pvVar3 + 0x14) != '\0' ||
         (cVar9 = (**(code **)((long)pvVar3 + 0x28))(puVar2,*(undefined8 *)((long)pvVar3 + 0x30)),
         cVar9 == '\0'))) {
LAB_00b2f134:
    plVar16 = plVar16->next;
    if ((plVar16 == (list_item *)0x0) || (pvVar3 = plVar16->data, pvVar3 == (void *)0x0)) {
      puVar2->invalid_error = 10;
      break;
    }
  }
LAB_00b2f1af:
  uVar15 = 0x10001;
LAB_00b2f1b8:
  uc->cpu->tcg_exit_req = 0;
  (*pCVar21->cpu_exec_exit)((CPUState_conflict *)cpu);
  return uVar15;
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}